

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTPNListBase::add_element(CTPNListBase *this,CTcPrsNode *expr)

{
  int iVar1;
  CTPNListEleBase *this_00;
  CTcPrsNode *in_RDI;
  CTPNListEle *ele;
  
  this_00 = (CTPNListEleBase *)CTcPrsAllocObj::operator_new(0x254b91);
  CTPNListEle::CTPNListEle((CTPNListEle *)this_00,in_RDI);
  *(int *)&in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       *(int *)&in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 1;
  CTPNListEleBase::set_prev
            (this_00,(CTPNListEle *)in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase);
  if (in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase == (_func_int **)0x0) {
    in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)this_00;
  }
  else {
    CTPNListEleBase::set_next
              ((CTPNListEleBase *)in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase,
               (CTPNListEle *)this_00);
  }
  in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)this_00;
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x254c2f);
  if (iVar1 == 0) {
    *(byte *)&in_RDI[9].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         *(byte *)&in_RDI[9].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe;
  }
  return;
}

Assistant:

void CTPNListBase::add_element(CTcPrsNode *expr)
{
    CTPNListEle *ele;
    
    /* create a list element object for the new element */
    ele = new CTPNListEle(expr);

    /* count the new entry */
    ++cnt_;

    /* add the element to our linked list */
    ele->set_prev(tail_);
    if (tail_ != 0)
        tail_->set_next(ele);
    else
        head_ = ele;
    tail_ = ele;

    /* 
     *   if the new element does not have a constant value, the list no
     *   longer has a constant value (if it did before) 
     */
    if (!expr->is_const())
        is_const_ = FALSE;
}